

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O1

void __thiscall
Assimp::AMFImporter::PostprocessHelper_CreateMeshDataArray
          (AMFImporter *this,CAMFImporter_NodeElement_Mesh *pNodeElement,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertexCoordinateArray,
          vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
          *pVertexColorArray)

{
  _List_node_base *p_Var1;
  pointer *ppaVar2;
  EType EVar3;
  long lVar4;
  CAMFImporter_NodeElement_Color *pCVar5;
  iterator __position;
  undefined8 uVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  long lVar9;
  undefined8 *puVar10;
  
  p_Var8 = (pNodeElement->super_CAMFImporter_NodeElement).Child.
           super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  p_Var7 = (_List_node_base *)0x0;
  while (p_Var8 != (_List_node_base *)&(pNodeElement->super_CAMFImporter_NodeElement).Child) {
    p_Var1 = p_Var8 + 1;
    p_Var8 = p_Var8->_M_next;
    if (*(int *)&p_Var1->_M_next->_M_prev == 0xe) {
      p_Var7 = p_Var1->_M_next;
    }
  }
  if (p_Var7 != (_List_node_base *)0x0) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (pVertexCoordinateArray,(size_type)*(_List_node_base **)((long)(p_Var7 + 4) + 8));
    std::vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
    ::resize(pVertexColorArray,(size_type)*(_List_node_base **)((long)(p_Var7 + 4) + 8));
    p_Var8 = *(_List_node_base **)((long)(p_Var7 + 3) + 8);
    if (p_Var8 != (_List_node_base *)((long)(p_Var7 + 3) + 8U)) {
      lVar9 = 0;
      do {
        lVar4 = (long)p_Var8[1]._M_next;
        if (*(int *)(lVar4 + 8) == 0xd) {
          (pVertexColorArray->
          super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
          )._M_impl.super__Vector_impl_data._M_start[lVar9] = (CAMFImporter_NodeElement_Color *)0x0;
          for (puVar10 = *(undefined8 **)(lVar4 + 0x38); puVar10 != (undefined8 *)(lVar4 + 0x38);
              puVar10 = (undefined8 *)*puVar10) {
            pCVar5 = (CAMFImporter_NodeElement_Color *)puVar10[2];
            EVar3 = (pCVar5->super_CAMFImporter_NodeElement).Type;
            if (EVar3 == ENET_Color) {
              (pVertexColorArray->
              super__Vector_base<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
              )._M_impl.super__Vector_impl_data._M_start[lVar9] = pCVar5;
            }
            else if (EVar3 == ENET_Coordinates) {
              __position._M_current =
                   (pVertexCoordinateArray->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (pVertexCoordinateArray->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                _M_realloc_insert<aiVector3t<float>const&>
                          ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                           pVertexCoordinateArray,__position,(aiVector3t<float> *)&pCVar5->Composed)
                ;
              }
              else {
                (__position._M_current)->z = *(float *)&pCVar5->Color_Composed[0]._M_dataplus._M_p;
                uVar6 = *(undefined8 *)&pCVar5->Composed;
                (__position._M_current)->x = (float)(int)uVar6;
                (__position._M_current)->y = (float)(int)((ulong)uVar6 >> 0x20);
                ppaVar2 = &(pVertexCoordinateArray->
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar2 = *ppaVar2 + 1;
              }
            }
          }
          lVar9 = lVar9 + 1;
        }
        p_Var8 = p_Var8->_M_next;
      } while (p_Var8 != (_List_node_base *)((long)(p_Var7 + 3) + 8U));
    }
  }
  return;
}

Assistant:

void AMFImporter::PostprocessHelper_CreateMeshDataArray(const CAMFImporter_NodeElement_Mesh& pNodeElement, std::vector<aiVector3D>& pVertexCoordinateArray,
														std::vector<CAMFImporter_NodeElement_Color*>& pVertexColorArray) const
{
    CAMFImporter_NodeElement_Vertices* vn = nullptr;
    size_t col_idx;

	// All data stored in "vertices", search for it.
	for(CAMFImporter_NodeElement* ne_child: pNodeElement.Child)
	{
		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Vertices) vn = (CAMFImporter_NodeElement_Vertices*)ne_child;
	}

	// If "vertices" not found then no work for us.
	if(vn == nullptr) return;

	pVertexCoordinateArray.reserve(vn->Child.size());// all coordinates stored as child and we need to reserve space for future push_back's.
	pVertexColorArray.resize(vn->Child.size());// colors count equal vertices count.
	col_idx = 0;
	// Inside vertices collect all data and place to arrays
	for(CAMFImporter_NodeElement* vn_child: vn->Child)
	{
		// vertices, colors
		if(vn_child->Type == CAMFImporter_NodeElement::ENET_Vertex)
		{
			// by default clear color for current vertex
			pVertexColorArray[col_idx] = nullptr;

			for(CAMFImporter_NodeElement* vtx: vn_child->Child)
			{
				if(vtx->Type == CAMFImporter_NodeElement::ENET_Coordinates)
				{
					pVertexCoordinateArray.push_back(((CAMFImporter_NodeElement_Coordinates*)vtx)->Coordinate);

					continue;
				}

				if(vtx->Type == CAMFImporter_NodeElement::ENET_Color)
				{
					pVertexColorArray[col_idx] = (CAMFImporter_NodeElement_Color*)vtx;

					continue;
				}
			}// for(CAMFImporter_NodeElement* vtx: vn_child->Child)

			col_idx++;
		}// if(vn_child->Type == CAMFImporter_NodeElement::ENET_Vertex)
	}// for(CAMFImporter_NodeElement* vn_child: vn->Child)
}